

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

CallArgHandler __thiscall
mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::BeginCall
          (NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *this,int func_index,
          int num_args)

{
  Function func;
  Error *this_00;
  CallArgHandler CVar2;
  CallExprBuilder CVar1;
  
  func.impl_ = (this->builder_->super_ExprFactory).funcs_.
               super__Vector_base<const_mp::Function::Impl_*,_std::allocator<const_mp::Function::Impl_*>_>
               ._M_impl.super__Vector_impl_data._M_start[func_index];
  if (func.impl_ != (Impl *)0x0) {
    CVar1 = BasicExprFactory<std::allocator<char>_>::BeginCall
                      (&this->builder_->super_ExprFactory,func,num_args);
    CVar2.impl_ = CVar1.impl_;
    CVar2.arg_index_ = CVar1.arg_index_;
    CVar2._12_4_ = CVar1._12_4_;
    return CVar2;
  }
  this_00 = (Error *)__cxa_allocate_exception(0x18);
  Error::Error(this_00,(CStringRef)0x2c01f4,func_index);
  __cxa_throw(this_00,&Error::typeinfo,fmt::SystemError::~SystemError);
}

Assistant:

CallArgHandler BeginCall(int func_index, int num_args) {
    // Check if the function is defined.
    if (Function func = builder_.function(func_index))
      return builder_.BeginCall(func, num_args);
    throw Error("function {} is not defined", func_index);
  }